

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

void __thiscall CLI::App::parse(App *this,int argc,char **argv)

{
  uint uVar1;
  char *pcVar2;
  char *__s;
  long lVar3;
  char **__args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pcVar2 = (char *)(this->name_)._M_string_length;
  if ((pcVar2 == (char *)0x0) || (this->has_automatic_name_ == true)) {
    this->has_automatic_name_ = true;
    __s = *argv;
    strlen(__s);
    ::std::__cxx11::string::_M_replace((ulong)&this->name_,0,pcVar2,(ulong)__s);
  }
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = argc - 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&local_48,(long)(int)uVar1);
  if (1 < argc) {
    __args = argv + uVar1;
    lVar3 = (ulong)uVar1 + 1;
    do {
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*const&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 __args);
      lVar3 = lVar3 + -1;
      __args = __args + -1;
    } while (1 < lVar3);
  }
  parse(this,&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void parse(int argc, const char *const *argv) {
        // If the name is not set, read from command line
        if(name_.empty() || has_automatic_name_) {
            has_automatic_name_ = true;
            name_ = argv[0];
        }

        std::vector<std::string> args;
        args.reserve(static_cast<size_t>(argc - 1));
        for(int i = argc - 1; i > 0; i--)
            args.emplace_back(argv[i]);
        parse(std::move(args));
    }